

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  uint first_byte_or_zero;
  int iVar4;
  uint8 *buffer;
  uint32 type_id_00;
  uint32 type_id;
  string message_data;
  uint32 local_bc;
  uint8 *local_b8;
  long local_b0;
  uint8 local_a8 [16];
  CodedInputStream local_98;
  ExtensionSet *local_48;
  ExtensionFinder *local_40;
  FieldSkipper *local_38;
  
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = '\0';
  type_id_00 = 0;
  local_48 = this;
  local_40 = extension_finder;
  local_38 = field_skipper;
LAB_00281e94:
  do {
    pbVar1 = input->buffer_;
    if (pbVar1 < input->buffer_end_) {
      first_byte_or_zero = (uint)*pbVar1;
      if ((char)*pbVar1 < '\0') goto LAB_00281eae;
      input->buffer_ = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_00281eae:
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (first_byte_or_zero != 0x1a) {
      if (first_byte_or_zero != 0) {
        if (first_byte_or_zero == 0xc) {
          type_id_00 = 1;
          goto LAB_00282016;
        }
        if (first_byte_or_zero != 0x10) {
          iVar4 = (*field_skipper->_vptr_FieldSkipper[2])
                            (field_skipper,input,(ulong)first_byte_or_zero);
          cVar2 = (char)iVar4;
          goto LAB_00281efa;
        }
        bVar3 = io::CodedInputStream::ReadVarint32(input,&local_bc);
        type_id_00 = local_bc;
        if (bVar3) {
          if (local_b0 == 0) goto LAB_00281e94;
          local_98.buffer_ = local_b8;
          local_98.total_bytes_read_ = (int)local_b0;
          local_98.buffer_end_ = local_b8 + local_98.total_bytes_read_;
          local_98.input_ = (ZeroCopyInputStream *)0x0;
          local_98.legitimate_message_end_ = false;
          local_98.aliasing_enabled_ = false;
          local_98.overflow_bytes_ = 0;
          local_98.last_tag_ = 0;
          local_98.buffer_size_after_limit_ = 0;
          local_98.total_bytes_limit_ = 0x7fffffff;
          local_98.extension_pool_ = (DescriptorPool *)0x0;
          local_98.extension_factory_ = (MessageFactory *)0x0;
          local_98.recursion_budget_ = input->recursion_budget_;
          local_98.current_limit_ = local_98.total_bytes_read_;
          local_98.recursion_limit_ = local_98.recursion_budget_;
          bVar3 = ParseMessageSetItemLite(google::protobuf::io::CodedInputStream*,google::protobuf::
                  internal::ExtensionFinder*,google::protobuf::internal::FieldSkipper*)::MSLite::
                  ParseField(int,google::protobuf::io::CodedInputStream__
                            (&local_48,local_bc,&local_98);
          if (bVar3) {
            local_b0 = 0;
            *local_b8 = '\0';
            io::CodedInputStream::~CodedInputStream(&local_98);
            goto LAB_00281e94;
          }
          io::CodedInputStream::~CodedInputStream(&local_98);
        }
      }
LAB_00282013:
      type_id_00 = 0;
      goto LAB_00282016;
    }
    if (type_id_00 == 0) {
      bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_98);
      if ((!bVar3) || ((int)(uint)local_98.buffer_ < 0)) goto LAB_00282013;
      iVar4 = 0x1f;
      if (((uint)local_98.buffer_ | 1) != 0) {
        for (; ((uint)local_98.buffer_ | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      std::__cxx11::string::resize((ulong)&local_b8);
      buffer = io::CodedOutputStream::WriteVarint32ToArray((uint)local_98.buffer_,local_b8);
      bVar3 = io::CodedInputStream::ReadRaw(input,buffer,(uint)local_98.buffer_);
      type_id_00 = 0;
      if (!bVar3) {
LAB_00282016:
        std::__cxx11::string::~string((string *)&local_b8);
        return SUB41(type_id_00,0);
      }
    }
    else {
      cVar2 = ParseMessageSetItemLite(google::protobuf::io::CodedInputStream*,google::protobuf::
              internal::ExtensionFinder*,google::protobuf::internal::FieldSkipper*)::MSLite::
              ParseField(int,google::protobuf::io::CodedInputStream__(&local_48,type_id_00,input);
LAB_00281efa:
      if (cVar2 == '\0') goto LAB_00282013;
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItemLite(io::CodedInputStream* input,
                                           ExtensionFinder* extension_finder,
                                           FieldSkipper* field_skipper) {
  struct MSLite {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      return me->ParseField(
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED + 8 * type_id, input,
          extension_finder, field_skipper);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return field_skipper->SkipField(input, tag);
    }

    ExtensionSet* me;
    ExtensionFinder* extension_finder;
    FieldSkipper* field_skipper;
  };

  return ParseMessageSetItemImpl(input,
                                 MSLite{this, extension_finder, field_skipper});
}